

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

void __thiscall
btSoftBodyCollisionShape::getAabb
          (btSoftBodyCollisionShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btScalar bVar1;
  btScalar bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  btSoftBody *pbVar5;
  long lVar6;
  btVector3 *other;
  btScalar local_168;
  btScalar bStack_164;
  btScalar local_158;
  btScalar bStack_154;
  btVector3 local_128;
  btScalar local_118 [4];
  btScalar local_108 [4];
  btScalar local_f8 [4];
  btScalar local_e8 [4];
  btScalar local_d8 [4];
  btScalar local_c8 [4];
  btScalar local_b8 [4];
  btVector3 local_a0;
  btVector3 local_90;
  btVector3 local_80;
  btVector3 local_70;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  btVector3 local_30;
  
  pbVar5 = this->m_body;
  bVar1 = pbVar5->m_bounds[0].m_floats[2];
  bVar2 = pbVar5->m_bounds[1].m_floats[2];
  uVar3 = *(undefined8 *)pbVar5->m_bounds[0].m_floats;
  local_70.m_floats[3] = 0.0;
  uVar4 = *(undefined8 *)pbVar5->m_bounds[1].m_floats;
  local_70.m_floats._0_8_ = uVar3;
  local_70.m_floats[2] = bVar1;
  local_128 = btTransform::operator()(t,&local_70);
  local_168 = (btScalar)uVar4;
  local_30.m_floats[0] = local_168;
  bStack_154 = SUB84(uVar3,4);
  local_30.m_floats[1] = bStack_154;
  local_30.m_floats[3] = 0.0;
  local_30.m_floats[2] = bVar1;
  local_118 = (btScalar  [4])btTransform::operator()(t,&local_30);
  local_80.m_floats[3] = 0.0;
  local_80.m_floats._0_8_ = uVar4;
  local_80.m_floats[2] = bVar1;
  local_108 = (btScalar  [4])btTransform::operator()(t,&local_80);
  local_158 = (btScalar)uVar3;
  local_40.m_floats[0] = local_158;
  bStack_164 = SUB84(uVar4,4);
  local_40.m_floats[1] = bStack_164;
  local_40.m_floats[3] = 0.0;
  local_40.m_floats[2] = bVar1;
  local_f8 = (btScalar  [4])btTransform::operator()(t,&local_40);
  local_90.m_floats[3] = 0.0;
  local_90.m_floats._0_8_ = uVar3;
  local_90.m_floats[2] = bVar2;
  local_e8 = (btScalar  [4])btTransform::operator()(t,&local_90);
  local_50.m_floats[0] = local_168;
  local_50.m_floats[1] = bStack_154;
  local_50.m_floats[3] = 0.0;
  local_50.m_floats[2] = bVar2;
  local_d8 = (btScalar  [4])btTransform::operator()(t,&local_50);
  local_a0.m_floats[3] = 0.0;
  local_a0.m_floats._0_8_ = uVar4;
  local_a0.m_floats[2] = bVar2;
  local_c8 = (btScalar  [4])btTransform::operator()(t,&local_a0);
  local_60.m_floats[0] = local_158;
  local_60.m_floats[1] = bStack_164;
  local_60.m_floats[3] = 0.0;
  local_60.m_floats[2] = bVar2;
  local_b8 = (btScalar  [4])btTransform::operator()(t,&local_60);
  *(undefined8 *)aabbMax->m_floats = local_128.m_floats._0_8_;
  *(undefined8 *)(aabbMax->m_floats + 2) = local_128.m_floats._8_8_;
  *(undefined8 *)aabbMin->m_floats = local_128.m_floats._0_8_;
  *(undefined8 *)(aabbMin->m_floats + 2) = local_128.m_floats._8_8_;
  for (lVar6 = 0x10; lVar6 != 0x80; lVar6 = lVar6 + 0x10) {
    other = (btVector3 *)((long)local_128.m_floats + lVar6);
    btVector3::setMin(aabbMin,other);
    btVector3::setMax(aabbMax,other);
  }
  return;
}

Assistant:

virtual void getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
	{
		/* t is usually identity, except when colliding against btCompoundShape. See Issue 512 */
		const btVector3	mins=m_body->m_bounds[0];
		const btVector3	maxs=m_body->m_bounds[1];
		const btVector3	crns[]={t*btVector3(mins.x(),mins.y(),mins.z()),
			t*btVector3(maxs.x(),mins.y(),mins.z()),
			t*btVector3(maxs.x(),maxs.y(),mins.z()),
			t*btVector3(mins.x(),maxs.y(),mins.z()),
			t*btVector3(mins.x(),mins.y(),maxs.z()),
			t*btVector3(maxs.x(),mins.y(),maxs.z()),
			t*btVector3(maxs.x(),maxs.y(),maxs.z()),
			t*btVector3(mins.x(),maxs.y(),maxs.z())};
		aabbMin=aabbMax=crns[0];
		for(int i=1;i<8;++i)
		{
			aabbMin.setMin(crns[i]);
			aabbMax.setMax(crns[i]);
		}
	}